

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O3

pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::insert(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *this,value_type entry)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *__dest;
  undefined8 __src;
  ulong __n;
  pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> pVar3;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_50;
  anon_union_16_2_67f50693_for_value local_48;
  unsigned_long local_38;
  
  uVar1 = entry.first.value.pointer.length;
  __src = entry.first.value.pointer.ptr;
  if ((uint)entry.first.value._0_4_ < 0xd) {
    pVar3 = std::
            _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<duckdb::string_t_const,unsigned_long>>
                      ((_Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
                        *)&this->map,&entry);
  }
  else {
    local_48._0_8_ = entry.first.value._0_8_;
    local_48.pointer.ptr = entry.first.value.pointer.ptr;
    __n = local_48._0_8_ & 0xffffffff;
    __dest = (char *)duckdb::Allocator::AllocateData((ulong)this->allocator);
    if ((uint)uVar1 < 0xd) {
      __src = local_48.pointer.prefix;
    }
    memcpy(__dest,(void *)__src,__n);
    if ((uint)uVar1 < 0xd) {
      local_50 = 0;
      local_58 = 0;
      uStack_54 = 0;
      if (uVar1 == 0) {
        uVar2 = 0;
        __dest = (char *)0x0;
      }
      else {
        memcpy(&local_58,local_48.pointer.prefix,__n);
        __dest = (char *)CONCAT44(local_50,uStack_54);
        uVar2 = local_58;
      }
    }
    else {
      uVar2 = *(undefined4 *)__dest;
    }
    local_48._0_8_ = CONCAT44(uVar2,uVar1);
    local_38 = entry.second;
    local_48.pointer.ptr = __dest;
    pVar3 = std::
            _Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
            ::_M_emplace_unique<std::pair<duckdb::string_t,unsigned_long>>
                      ((_Rb_tree<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::_Select1st<std::pair<duckdb::string_t_const,unsigned_long>>,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>
                        *)&this->map,(pair<duckdb::string_t,_unsigned_long> *)&local_48.pointer);
  }
  return pVar3;
}

Assistant:

pair<iterator, bool> insert(value_type entry) { // NOLINT: match std style
		if (entry.first.IsInlined()) {
			return map.insert(std::move(entry));
		} else {
			return map.insert(make_pair(CopyString(entry.first), std::move(entry.second)));
		}
	}